

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

string * __thiscall
bloaty::(anonymous_namespace)::PercentString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,double percent,bool diff_mode)

{
  double dVar1;
  undefined7 in_register_00000011;
  char *fmt;
  char *pcVar2;
  string *this_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [16];
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar2 = (char *)CONCAT71(in_register_00000011,diff_mode);
  if ((int)this == 0) {
    DoubleStringPrintf_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)"%5.1F%%",pcVar2,percent);
  }
  else {
    if (percent == 0.0) {
      pcVar2 = " [ = ]";
    }
    else if ((percent != -100.0) || (NAN(percent))) {
      if (ABS(percent) != INFINITY) {
        str._M_dataplus._M_p = (pointer)&str.field_2;
        str._M_string_length = 0;
        str.field_2._M_local_buf[0] = '\0';
        if (percent <= 1000.0) {
          if (percent <= 10.0) {
            DoubleStringPrintf_abi_cxx11_
                      (&local_c8,(_anonymous_namespace_ *)"%+5.1F%%",pcVar2,percent);
          }
          else {
            DoubleStringPrintf_abi_cxx11_
                      (&local_c8,(_anonymous_namespace_ *)"%+4.0f%%",pcVar2,percent);
          }
          this_00 = &local_c8;
          std::__cxx11::string::operator=((string *)&str,(string *)this_00);
        }
        else {
          dVar1 = log10(percent);
          local_a8._8_4_ = extraout_XMM0_Dc;
          local_a8._0_8_ = dVar1 + -1.0;
          local_a8._12_4_ = extraout_XMM0_Dd;
          dVar1 = pow(10.0,(double)(int)(dVar1 + -1.0));
          DoubleStringPrintf_abi_cxx11_
                    (&local_70,(_anonymous_namespace_ *)"%+2.0f",fmt,percent / dVar1);
          std::operator+(&local_50,&local_70,"e");
          std::__cxx11::to_string(&local_90,(int)(double)local_a8._0_8_);
          std::operator+(&local_30,&local_50,&local_90);
          std::operator+(&local_c8,&local_30,"%");
          std::__cxx11::string::operator=((string *)&str,(string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_30);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_50);
          this_00 = &local_70;
        }
        std::__cxx11::string::~string((string *)this_00);
        anon_unknown_34::LeftPad(__return_storage_ptr__,&str,6);
        std::__cxx11::string::~string((string *)&str);
        return __return_storage_ptr__;
      }
      pcVar2 = " [NEW]";
    }
    else {
      pcVar2 = " [DEL]";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar2,(allocator<char> *)&str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PercentString(double percent, bool diff_mode) {
  if (diff_mode) {
    if (percent == 0 || std::isnan(percent)) {
      return " [ = ]";
    } else if (percent == -100) {
      return " [DEL]";
    } else if (std::isinf(percent)) {
      return " [NEW]";
    } else {
      // We want to keep this fixed-width even if the percent is very large.
      std::string str;
      if (percent > 1000) {
        int digits = log10(percent) - 1;
        str = DoubleStringPrintf("%+2.0f", percent / pow(10, digits)) + "e" +
              std::to_string(digits) + "%";
      } else if (percent > 10) {
        str = DoubleStringPrintf("%+4.0f%%", percent);
      } else {
        str = DoubleStringPrintf("%+5.1F%%", percent);
      }

      return LeftPad(str, 6);
    }
  } else {
    return DoubleStringPrintf("%5.1F%%", percent);
  }
}